

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O2

void dynamicgraph::signal_io<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::trace
               (matrix_type *value,ostream *os)

{
  int iVar1;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  WithFormat<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_120;
  
  if (signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::row_format == '\0') {
    iVar1 = __cxa_guard_acquire(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                                 trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)
                                 ::row_format);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"\t",&local_1c1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"\t",&local_1c2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_1c4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_1c5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_1c6);
      Eigen::IOFormat::IOFormat
                (&trace::row_format,-1,1,(string *)&local_120,&local_1a0,&local_1c0,&local_140,
                 &local_160,&local_180,' ');
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_120);
      __cxa_atexit(Eigen::IOFormat::~IOFormat,&trace::row_format,&__dso_handle);
      __cxa_guard_release(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                           trace(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::
                           row_format);
    }
  }
  local_120.m_matrix = value;
  Eigen::IOFormat::IOFormat(&local_120.m_format,&trace::row_format);
  Eigen::operator<<(os,&local_120);
  Eigen::IOFormat::~IOFormat(&local_120.m_format);
  return;
}

Assistant:

inline static void trace(const matrix_type &value, std::ostream &os) {
    static const Eigen::IOFormat row_format(Eigen::StreamPrecision,
                                            Eigen::DontAlignCols, "\t", "\t",
                                            "", "", "", "");
    os << value.format(row_format);
  }